

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_longstring(LexState *ls,TValue *tv,int sep)

{
  LexChar LVar1;
  byte *pbVar2;
  int iVar3;
  GCstr *pGVar4;
  SBuf *pSVar5;
  ErrMsg em;
  uint local_1d8;
  uint local_1d4;
  uint local_1cc;
  GCstr *str;
  int sep_local;
  TValue *tv_local;
  LexState *ls_local;
  char *w;
  char *w_1;
  char *w_3;
  char *w_2;
  char *local_58;
  char *local_40;
  char *local_28;
  char *local_10;
  
  LVar1 = ls->c;
  pSVar5 = &ls->sb;
  if ((int)(ls->sb).e == (int)pSVar5->w) {
    local_10 = lj_buf_more2(pSVar5,1);
  }
  else {
    local_10 = pSVar5->w;
  }
  *local_10 = (char)LVar1;
  pSVar5->w = local_10 + 1;
  if (ls->p < ls->pe) {
    pbVar2 = (byte *)ls->p;
    ls->p = (char *)(pbVar2 + 1);
    local_1cc = (uint)*pbVar2;
  }
  else {
    local_1cc = lex_more(ls);
  }
  ls->c = local_1cc;
  if ((ls->c == 10) || (ls->c == 0xd)) {
    lex_newline(ls);
  }
  do {
    while( true ) {
      while( true ) {
        iVar3 = ls->c;
        if (iVar3 == -1) {
          em = LJ_ERR_XLCOM;
          if (tv != (TValue *)0x0) {
            em = LJ_ERR_XLSTR;
          }
          lj_lex_error(ls,0x121,em);
        }
        if ((iVar3 != 10) && (iVar3 != 0xd)) break;
        pSVar5 = &ls->sb;
        if ((int)(ls->sb).e == (int)pSVar5->w) {
          local_58 = lj_buf_more2(pSVar5,1);
        }
        else {
          local_58 = pSVar5->w;
        }
        *local_58 = '\n';
        pSVar5->w = local_58 + 1;
        lex_newline(ls);
        if (tv == (TValue *)0x0) {
          (ls->sb).w = (ls->sb).b;
        }
      }
      if (iVar3 == 0x5d) break;
      LVar1 = ls->c;
      pSVar5 = &ls->sb;
      if ((int)(ls->sb).e == (int)pSVar5->w) {
        local_40 = lj_buf_more2(pSVar5,1);
      }
      else {
        local_40 = pSVar5->w;
      }
      *local_40 = (char)LVar1;
      pSVar5->w = local_40 + 1;
      if (ls->p < ls->pe) {
        pbVar2 = (byte *)ls->p;
        ls->p = (char *)(pbVar2 + 1);
        local_1d8 = (uint)*pbVar2;
      }
      else {
        local_1d8 = lex_more(ls);
      }
      ls->c = local_1d8;
    }
    iVar3 = lex_skipeq(ls);
  } while (iVar3 != sep);
  LVar1 = ls->c;
  pSVar5 = &ls->sb;
  if ((int)(ls->sb).e == (int)pSVar5->w) {
    local_28 = lj_buf_more2(pSVar5,1);
  }
  else {
    local_28 = pSVar5->w;
  }
  *local_28 = (char)LVar1;
  pSVar5->w = local_28 + 1;
  if (ls->p < ls->pe) {
    pbVar2 = (byte *)ls->p;
    ls->p = (char *)(pbVar2 + 1);
    local_1d4 = (uint)*pbVar2;
  }
  else {
    local_1d4 = lex_more(ls);
  }
  ls->c = local_1d4;
  if (tv != (TValue *)0x0) {
    pGVar4 = lj_parse_keepstr(ls,(ls->sb).b + (sep + 2),
                              (ulong)(uint)(((int)(ls->sb).w - (int)(ls->sb).b) + (sep + 2) * -2));
    tv->u64 = (ulong)pGVar4 | 0xfffd800000000000;
  }
  return;
}

Assistant:

static void lex_longstring(LexState *ls, TValue *tv, int sep)
{
  lex_savenext(ls);  /* Skip second '['. */
  if (lex_iseol(ls))  /* Skip initial newline. */
    lex_newline(ls);
  for (;;) {
    switch (ls->c) {
    case LEX_EOF:
      lj_lex_error(ls, TK_eof, tv ? LJ_ERR_XLSTR : LJ_ERR_XLCOM);
      break;
    case ']':
      if (lex_skipeq(ls) == sep) {
	lex_savenext(ls);  /* Skip second ']'. */
	goto endloop;
      }
      break;
    case '\n':
    case '\r':
      lex_save(ls, '\n');
      lex_newline(ls);
      if (!tv) lj_buf_reset(&ls->sb);  /* Don't waste space for comments. */
      break;
    default:
      lex_savenext(ls);
      break;
    }
  } endloop:
  if (tv) {
    GCstr *str = lj_parse_keepstr(ls, ls->sb.b + (2 + (MSize)sep),
				      sbuflen(&ls->sb) - 2*(2 + (MSize)sep));
    setstrV(ls->L, tv, str);
  }
}